

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O2

QCborValueRef __thiscall QCborValue::operator[](QCborValue *this,QLatin1StringView key)

{
  QCborValueConstRef QVar1;
  
  QVar1 = (QCborValueConstRef)
          QCborContainerPrivate::findOrAddMapKey<QLatin1String>((QCborValue *)this,key);
  return (QCborValueRef)QVar1;
}

Assistant:

QCborValueRef QCborValue::operator[](QLatin1StringView key)
{
    return QCborContainerPrivate::findOrAddMapKey(*this, key);
}